

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Block * __thiscall wasm::Builder::makeBlock(Builder *this,Expression *first)

{
  Block *pBVar1;
  _Storage<wasm::Type,_true> local_30;
  undefined1 local_28;
  Block *local_20;
  Block *ret;
  Expression *first_local;
  Builder *this_local;
  
  ret = (Block *)first;
  first_local = (Expression *)this;
  local_20 = MixedArena::alloc<wasm::Block>(&this->wasm->allocator);
  if (ret != (Block *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_20->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)ret);
    pBVar1 = local_20;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_30);
    wasm::Block::finalize(pBVar1,local_30,local_28,0);
  }
  return local_20;
}

Assistant:

Block* makeBlock(Expression* first = nullptr) {
    auto* ret = wasm.allocator.alloc<Block>();
    if (first) {
      ret->list.push_back(first);
      ret->finalize();
    }
    return ret;
  }